

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O0

bool __thiscall
soplex::SoPlexBase<double>::getPrimal(SoPlexBase<double> *this,VectorBase<double> *vector)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  SoPlexBase<double> *in_RDI;
  undefined4 in_stack_ffffffffffffffd8;
  
  bVar1 = hasSol(in_RDI);
  if (bVar1) {
    iVar2 = VectorBase<double>::dim((VectorBase<double> *)0x449e0d);
    iVar3 = numCols((SoPlexBase<double> *)0x449e1b);
    if (iVar3 <= iVar2) {
      _syncRealSolution(in_RDI);
      SolBase<double>::getPrimalSol
                ((SolBase<double> *)in_RDI,
                 (VectorBase<double> *)CONCAT44(iVar2,in_stack_ffffffffffffffd8));
      return true;
    }
  }
  return false;
}

Assistant:

bool SoPlexBase<R>::getPrimal(VectorBase<R>& vector)
{
   if(hasSol() && vector.dim() >= numCols())
   {
      _syncRealSolution();
      _solReal.getPrimalSol(vector);
      return true;
   }
   else
      return false;
}